

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear_pack4.h
# Opt level: O0

void ncnn::resize_bilinear_image_pack4
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  undefined8 *puVar1;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *in_R8;
  long in_R9;
  __m128 _Dp;
  __m128 _rows1_2;
  __m128 _rows0_1;
  int dx_2;
  float *Dp;
  float *rows1p;
  float *rows0p;
  __m128 _b1;
  __m128 _b0;
  __m128 _rows1_1;
  __m128 _rows0;
  __m128 _S11_1;
  __m128 _S10_1;
  __m128 _S01;
  __m128 _S00;
  __m128 _a1_1;
  __m128 _a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_1;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  __m128 _rows1;
  __m128 _S11;
  __m128 _S10;
  __m128 _a1;
  __m128 _a0;
  float *S1p;
  int sx;
  int dx;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffff850;
  undefined8 **ppuVar2;
  int in_stack_fffffffffffff85c;
  undefined4 in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  int in_stack_fffffffffffff86c;
  undefined4 in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  int local_724;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_668;
  undefined8 *local_660;
  int local_658;
  int local_654;
  undefined8 *local_650;
  undefined8 *local_648;
  float *local_640;
  long local_638;
  long local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 *local_5d0;
  int local_5c8;
  int local_5c4;
  undefined8 *local_5c0;
  float *local_5b8;
  long local_5b0;
  undefined8 *local_5a8;
  int local_59c;
  int local_598;
  int local_594;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_570;
  int *local_568;
  undefined8 local_560;
  undefined4 local_558;
  long *local_550;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 local_540;
  undefined4 local_53c;
  undefined4 local_538;
  undefined8 local_530;
  undefined8 *local_528;
  int *local_520;
  undefined8 local_518;
  undefined4 local_510;
  long *local_508;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined8 local_4e8;
  int local_4e0;
  int local_4dc;
  long local_4d8;
  float *local_4d0;
  long local_4c8;
  float *local_4c0;
  long *local_4b8;
  long *local_4b0;
  undefined8 **local_4a8;
  undefined8 **local_498;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  int local_444;
  long *local_440;
  int local_434;
  long *local_430;
  int local_424;
  long *local_420;
  int local_414;
  long *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  int local_138;
  undefined4 local_134;
  undefined8 **local_130;
  int local_118;
  undefined4 local_114;
  undefined8 **local_110;
  undefined8 *local_108;
  undefined8 *local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined8 local_60;
  undefined4 local_54;
  undefined8 local_50;
  int local_44;
  undefined8 **local_40;
  undefined8 local_38;
  undefined4 local_2c;
  undefined8 local_28;
  int local_1c;
  undefined8 **local_18;
  undefined8 **local_10;
  undefined8 **local_8;
  
  local_4dc = *(int *)((long)in_RSI + 0x2c);
  local_4e0 = (int)in_RSI[6];
  local_40 = &local_528;
  local_50 = 0x10;
  local_54 = 4;
  local_60 = 0;
  local_528 = (undefined8 *)0x0;
  local_520 = (int *)0x0;
  local_518 = 0;
  local_510 = 0;
  local_508 = (long *)0x0;
  local_500 = 0;
  local_4fc = 0;
  local_4f8 = 0;
  local_4f4 = 0;
  local_4f0 = 0;
  local_4e8 = 0;
  local_4d8 = in_R9;
  local_4d0 = in_R8;
  local_4c8 = in_RCX;
  local_4c0 = in_RDX;
  local_4b8 = in_RSI;
  local_4b0 = in_RDI;
  local_44 = local_4dc;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
              in_stack_fffffffffffff86c,
              CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
              in_stack_fffffffffffff85c,in_stack_fffffffffffff850);
  local_18 = &local_570;
  local_1c = local_4dc;
  local_28 = 0x10;
  local_2c = 4;
  local_38 = 0;
  local_570 = (undefined8 *)0x0;
  local_568 = (int *)0x0;
  local_560 = 0;
  local_558 = 0;
  local_550 = (long *)0x0;
  local_548 = 0;
  local_544 = 0;
  local_540 = 0;
  local_53c = 0;
  local_538 = 0;
  local_530 = 0;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
              in_stack_fffffffffffff86c,
              CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
              in_stack_fffffffffffff85c,in_stack_fffffffffffff850);
  local_8 = &local_528;
  local_588 = local_528;
  local_10 = &local_570;
  local_590 = local_570;
  local_594 = -2;
  for (local_598 = 0; puVar1 = local_588, local_598 < local_4e0; local_598 = local_598 + 1) {
    local_59c = *(int *)(local_4d8 + (long)local_598 * 4);
    if (local_59c != local_594) {
      if (local_59c == local_594 + 1) {
        local_5a8 = local_588;
        local_588 = local_590;
        local_590 = puVar1;
        local_424 = local_59c + 1;
        local_420 = local_4b0;
        local_5b0 = *local_4b0 +
                    (long)*(int *)((long)local_4b0 + 0x2c) * (long)local_424 * local_4b0[2];
        local_5b8 = local_4c0;
        local_5c0 = puVar1;
        for (local_5c4 = 0; local_5c4 < local_4dc; local_5c4 = local_5c4 + 1) {
          local_5c8 = *(int *)(local_4c8 + (long)local_5c4 * 4) << 2;
          local_5d0 = (undefined8 *)(local_5b0 + (long)local_5c8 * 4);
          local_2e8 = *local_5b8;
          local_5e8 = CONCAT44(local_2e8,local_2e8);
          uStack_5e0 = CONCAT44(local_2e8,local_2e8);
          local_308 = local_5b8[1];
          local_5f8 = CONCAT44(local_308,local_308);
          uStack_5f0 = CONCAT44(local_308,local_308);
          local_608 = *local_5d0;
          uStack_600 = local_5d0[1];
          local_458 = local_5d0 + 2;
          local_618 = *local_458;
          uStack_610 = local_5d0[3];
          local_258._0_4_ = (float)local_608;
          local_258._4_4_ = (float)((ulong)local_608 >> 0x20);
          uStack_250._0_4_ = (float)uStack_600;
          uStack_250._4_4_ = (float)((ulong)uStack_600 >> 0x20);
          local_628 = CONCAT44(local_258._4_4_ * local_2e8,(float)local_258 * local_2e8);
          uStack_620 = CONCAT44(uStack_250._4_4_ * local_2e8,(float)uStack_250 * local_2e8);
          local_170 = &local_618;
          local_178 = &local_5f8;
          local_180 = &local_628;
          local_158._0_4_ = (float)local_618;
          local_158._4_4_ = (float)((ulong)local_618 >> 0x20);
          uStack_150._0_4_ = (float)uStack_610;
          uStack_150._4_4_ = (float)((ulong)uStack_610 >> 0x20);
          local_d8._0_4_ = (float)local_158 * local_308;
          local_d8._4_4_ = local_158._4_4_ * local_308;
          local_d8._8_4_ = (float)uStack_150 * local_308;
          local_d8._12_4_ = uStack_150._4_4_ * local_308;
          local_e8 = local_628;
          uStack_e0 = uStack_620;
          local_628 = CONCAT44(local_d8._4_4_ + local_258._4_4_ * local_2e8,
                               local_d8._0_4_ + (float)local_258 * local_2e8);
          uStack_620 = CONCAT44(local_d8._12_4_ + uStack_250._4_4_ * local_2e8,
                                local_d8._8_4_ + (float)uStack_250 * local_2e8);
          local_390 = (undefined8 *)((long)puVar1 + (long)(local_5c4 << 2) * 4);
          *local_390 = local_628;
          local_390[1] = uStack_620;
          local_5b8 = local_5b8 + 2;
          local_450 = local_5d0;
          local_3a8 = local_628;
          uStack_3a0 = uStack_620;
          fStack_304 = local_308;
          fStack_300 = local_308;
          fStack_2fc = local_308;
          local_2ec = local_308;
          fStack_2e4 = local_2e8;
          fStack_2e0 = local_2e8;
          fStack_2dc = local_2e8;
          local_2cc = local_2e8;
          local_268 = local_5e8;
          uStack_260 = uStack_5e0;
          local_258 = local_608;
          uStack_250 = uStack_600;
          local_168 = local_5f8;
          uStack_160 = uStack_5f0;
          local_158 = local_618;
          uStack_150 = uStack_610;
        }
      }
      else {
        local_430 = local_4b0;
        local_630 = *local_4b0 +
                    (long)*(int *)((long)local_4b0 + 0x2c) * (long)local_59c * local_4b0[2];
        local_444 = local_59c + 1;
        local_440 = local_4b0;
        local_638 = *local_4b0 +
                    (long)*(int *)((long)local_4b0 + 0x2c) * (long)local_444 * local_4b0[2];
        local_640 = local_4c0;
        local_648 = local_588;
        local_650 = local_590;
        for (local_654 = 0; local_434 = local_59c, local_654 < local_4dc; local_654 = local_654 + 1)
        {
          local_658 = *(int *)(local_4c8 + (long)local_654 * 4) << 2;
          local_660 = (undefined8 *)(local_630 + (long)local_658 * 4);
          local_668 = (undefined8 *)(local_638 + (long)local_658 * 4);
          local_328 = *local_640;
          local_678 = CONCAT44(local_328,local_328);
          uStack_670 = CONCAT44(local_328,local_328);
          local_348 = local_640[1];
          local_688 = CONCAT44(local_348,local_348);
          uStack_680 = CONCAT44(local_348,local_348);
          local_698 = *local_660;
          uStack_690 = local_660[1];
          local_468 = local_660 + 2;
          local_6a8 = *local_468;
          uStack_6a0 = local_660[3];
          local_6b8 = *local_668;
          uStack_6b0 = local_668[1];
          local_478 = local_668 + 2;
          local_6c8 = *local_478;
          uStack_6c0 = local_668[3];
          local_278._0_4_ = (float)local_698;
          local_278._4_4_ = (float)((ulong)local_698 >> 0x20);
          uStack_270._0_4_ = (float)uStack_690;
          uStack_270._4_4_ = (float)((ulong)uStack_690 >> 0x20);
          local_6d8 = CONCAT44(local_278._4_4_ * local_328,(float)local_278 * local_328);
          uStack_6d0 = CONCAT44(uStack_270._4_4_ * local_328,(float)uStack_270 * local_328);
          local_298._0_4_ = (float)local_6b8;
          local_298._4_4_ = (float)((ulong)local_6b8 >> 0x20);
          uStack_290._0_4_ = (float)uStack_6b0;
          uStack_290._4_4_ = (float)((ulong)uStack_6b0 >> 0x20);
          local_6e8 = CONCAT44(local_298._4_4_ * local_328,(float)local_298 * local_328);
          uStack_6e0 = CONCAT44(uStack_290._4_4_ * local_328,(float)uStack_290 * local_328);
          local_1b0 = &local_6a8;
          local_1b8 = &local_688;
          local_1c0 = &local_6d8;
          local_198._0_4_ = (float)local_6a8;
          local_198._4_4_ = (float)((ulong)local_6a8 >> 0x20);
          uStack_190._0_4_ = (float)uStack_6a0;
          uStack_190._4_4_ = (float)((ulong)uStack_6a0 >> 0x20);
          local_b8 = (float)local_198 * local_348;
          fStack_b4 = local_198._4_4_ * local_348;
          fStack_b0 = (float)uStack_190 * local_348;
          fStack_ac = uStack_190._4_4_ * local_348;
          local_c8 = local_6d8;
          uStack_c0 = uStack_6d0;
          local_6d8 = CONCAT44(fStack_b4 + local_278._4_4_ * local_328,
                               local_b8 + (float)local_278 * local_328);
          uStack_6d0 = CONCAT44(fStack_ac + uStack_270._4_4_ * local_328,
                                fStack_b0 + (float)uStack_270 * local_328);
          local_1f0 = &local_6c8;
          local_1f8 = &local_688;
          local_200 = &local_6e8;
          local_1d8._0_4_ = (float)local_6c8;
          local_1d8._4_4_ = (float)((ulong)local_6c8 >> 0x20);
          uStack_1d0._0_4_ = (float)uStack_6c0;
          uStack_1d0._4_4_ = (float)((ulong)uStack_6c0 >> 0x20);
          local_98._0_4_ = (float)local_1d8 * local_348;
          local_98._4_4_ = local_1d8._4_4_ * local_348;
          local_98._8_4_ = (float)uStack_1d0 * local_348;
          local_98._12_4_ = uStack_1d0._4_4_ * local_348;
          local_a8 = local_6e8;
          uStack_a0 = uStack_6e0;
          local_6e8 = CONCAT44(local_98._4_4_ + local_298._4_4_ * local_328,
                               local_98._0_4_ + (float)local_298 * local_328);
          uStack_6e0 = CONCAT44(local_98._12_4_ + uStack_290._4_4_ * local_328,
                                local_98._8_4_ + (float)uStack_290 * local_328);
          local_3b0 = (undefined8 *)((long)local_588 + (long)(local_654 << 2) * 4);
          *local_3b0 = local_6d8;
          local_3b0[1] = uStack_6d0;
          local_3d0 = (undefined8 *)((long)local_590 + (long)(local_654 << 2) * 4);
          *local_3d0 = local_6e8;
          local_3d0[1] = uStack_6e0;
          local_640 = local_640 + 2;
          local_470 = local_668;
          local_460 = local_660;
          local_3e8 = local_6e8;
          uStack_3e0 = uStack_6e0;
          local_3c8 = local_6d8;
          uStack_3c0 = uStack_6d0;
          fStack_344 = local_348;
          fStack_340 = local_348;
          fStack_33c = local_348;
          local_32c = local_348;
          fStack_324 = local_328;
          fStack_320 = local_328;
          fStack_31c = local_328;
          local_30c = local_328;
          local_2a8 = local_678;
          uStack_2a0 = uStack_670;
          local_298 = local_6b8;
          uStack_290 = uStack_6b0;
          local_288 = local_678;
          uStack_280 = uStack_670;
          local_278 = local_698;
          uStack_270 = uStack_690;
          local_1e8 = local_688;
          uStack_1e0 = uStack_680;
          local_1d8 = local_6c8;
          uStack_1d0 = uStack_6c0;
          local_1a8 = local_688;
          uStack_1a0 = uStack_680;
          local_198 = local_6a8;
          uStack_190 = uStack_6a0;
        }
      }
    }
    local_368 = *local_4d0;
    local_6f8 = CONCAT44(local_368,local_368);
    uStack_6f0 = CONCAT44(local_368,local_368);
    local_388 = local_4d0[1];
    local_708 = CONCAT44(local_388,local_388);
    uStack_700 = CONCAT44(local_388,local_388);
    local_710 = local_588;
    local_718 = local_590;
    local_410 = local_4b8;
    local_414 = local_598;
    local_720 = (undefined8 *)
                (*local_4b8 +
                (long)*(int *)((long)local_4b8 + 0x2c) * (long)local_598 * local_4b8[2]);
    for (local_724 = 0; local_724 < local_4dc; local_724 = local_724 + 1) {
      local_480 = local_710;
      local_738 = *local_710;
      uStack_730 = local_710[1];
      local_488 = local_718;
      local_748 = *local_718;
      uStack_740 = local_718[1];
      local_2b8._0_4_ = (float)local_738;
      local_2b8._4_4_ = (float)((ulong)local_738 >> 0x20);
      uStack_2b0._0_4_ = (float)uStack_730;
      uStack_2b0._4_4_ = (float)((ulong)uStack_730 >> 0x20);
      local_758 = CONCAT44(local_2b8._4_4_ * local_368,(float)local_2b8 * local_368);
      uStack_750 = CONCAT44(uStack_2b0._4_4_ * local_368,(float)uStack_2b0 * local_368);
      local_230 = &local_748;
      local_238 = &local_708;
      local_240 = &local_758;
      local_218._0_4_ = (float)local_748;
      local_218._4_4_ = (float)((ulong)local_748 >> 0x20);
      uStack_210._0_4_ = (float)uStack_740;
      uStack_210._4_4_ = (float)((ulong)uStack_740 >> 0x20);
      local_78._0_4_ = (float)local_218 * local_388;
      local_78._4_4_ = local_218._4_4_ * local_388;
      local_78._8_4_ = (float)uStack_210 * local_388;
      local_78._12_4_ = uStack_210._4_4_ * local_388;
      local_88 = local_758;
      uStack_80 = uStack_750;
      local_758 = CONCAT44(local_78._4_4_ + local_2b8._4_4_ * local_368,
                           local_78._0_4_ + (float)local_2b8 * local_368);
      uStack_750 = CONCAT44(local_78._12_4_ + uStack_2b0._4_4_ * local_368,
                            local_78._8_4_ + (float)uStack_2b0 * local_368);
      local_3f0 = local_720;
      *local_720 = local_758;
      local_720[1] = uStack_750;
      local_720 = local_720 + 2;
      local_710 = local_710 + 2;
      local_718 = local_718 + 2;
      local_408 = local_758;
      uStack_400 = uStack_750;
      local_2c8 = local_6f8;
      uStack_2c0 = uStack_6f0;
      local_2b8 = local_738;
      uStack_2b0 = uStack_730;
      local_228 = local_708;
      uStack_220 = uStack_700;
      local_218 = local_748;
      uStack_210 = uStack_740;
    }
    local_4d0 = local_4d0 + 2;
    local_594 = local_59c;
    fStack_384 = local_388;
    fStack_380 = local_388;
    fStack_37c = local_388;
    local_36c = local_388;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    local_34c = local_368;
  }
  ppuVar2 = &local_570;
  local_4a8 = ppuVar2;
  local_110 = ppuVar2;
  if (local_568 != (int *)0x0) {
    local_114 = 0xffffffff;
    LOCK();
    local_118 = *local_568;
    *local_568 = *local_568 + -1;
    UNLOCK();
    if (local_118 == 1) {
      if (local_550 == (long *)0x0) {
        local_108 = local_570;
        if (local_570 != (undefined8 *)0x0) {
          free(local_570);
        }
      }
      else {
        (**(code **)(*local_550 + 0x18))(local_550,local_570);
      }
    }
  }
  *ppuVar2 = (undefined8 *)0x0;
  ppuVar2[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar2 + 3) = 0;
  *(undefined4 *)(ppuVar2 + 5) = 0;
  *(undefined4 *)((long)ppuVar2 + 0x2c) = 0;
  *(undefined4 *)(ppuVar2 + 6) = 0;
  *(undefined4 *)((long)ppuVar2 + 0x34) = 0;
  *(undefined4 *)(ppuVar2 + 7) = 0;
  ppuVar2[8] = (undefined8 *)0x0;
  ppuVar2[1] = (undefined8 *)0x0;
  local_498 = &local_528;
  if (local_520 != (int *)0x0) {
    local_134 = 0xffffffff;
    LOCK();
    local_138 = *local_520;
    *local_520 = *local_520 + -1;
    UNLOCK();
    if (local_138 == 1) {
      local_130 = local_498;
      if (local_508 == (long *)0x0) {
        local_f8 = local_528;
        if (local_528 != (undefined8 *)0x0) {
          free(local_528);
        }
      }
      else {
        (**(code **)(*local_508 + 0x18))(local_508,local_528);
      }
    }
  }
  return;
}

Assistant:

static void resize_bilinear_image_pack4(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)4 * 4u, 4);
    Mat rowsbuf1(w, (size_t)4 * 4u, 4);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S1p = S1 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);

                __m128 _S10 = _mm_load_ps(S1p);
                __m128 _S11 = _mm_load_ps(S1p + 4);
                __m128 _rows1 = _mm_mul_ps(_S10, _a0);
                _rows1 = _mm_comp_fmadd_ps(_S11, _a1, _rows1);
                _mm_store_ps(rows1p + dx * 4, _rows1);

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);

                __m128 _S00 = _mm_load_ps(S0p);
                __m128 _S01 = _mm_load_ps(S0p + 4);
                __m128 _S10 = _mm_load_ps(S1p);
                __m128 _S11 = _mm_load_ps(S1p + 4);
                __m128 _rows0 = _mm_mul_ps(_S00, _a0);
                __m128 _rows1 = _mm_mul_ps(_S10, _a0);
                _rows0 = _mm_comp_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm_comp_fmadd_ps(_S11, _a1, _rows1);
                _mm_store_ps(rows0p + dx * 4, _rows0);
                _mm_store_ps(rows1p + dx * 4, _rows1);

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m128 _b0 = _mm_set1_ps(beta[0]);
        __m128 _b1 = _mm_set1_ps(beta[1]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m128 _rows0 = _mm_load_ps(rows0p);
            __m128 _rows1 = _mm_load_ps(rows1p);
            __m128 _Dp = _mm_mul_ps(_rows0, _b0);
            _Dp = _mm_comp_fmadd_ps(_rows1, _b1, _Dp);
            _mm_store_ps(Dp, _Dp);

            Dp += 4;
            rows0p += 4;
            rows1p += 4;
        }

        beta += 2;
    }
}